

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O3

int luv_tcp_keepalive(lua_State *L)

{
  int iVar1;
  uint uVar2;
  uv_tcp_t *handle;
  lua_Integer lVar3;
  int in_ESI;
  
  handle = luv_check_tcp(L,in_ESI);
  luaL_checktype(L,2,1);
  iVar1 = lua_toboolean(L,2);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    lVar3 = luaL_checkinteger(L,3);
    uVar2 = (uint)lVar3;
  }
  uVar2 = uv_tcp_keepalive(handle,iVar1,uVar2);
  if ((int)uVar2 < 0) {
    luv_error(L,uVar2);
    iVar1 = 3;
  }
  else {
    lua_pushinteger(L,(ulong)uVar2);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int luv_tcp_keepalive(lua_State* L) {
  uv_tcp_t* handle = luv_check_tcp(L, 1);
  int ret, enable;
  unsigned int delay = 0;
  luaL_checktype(L, 2, LUA_TBOOLEAN);
  enable = lua_toboolean(L, 2);
  if (enable) {
    delay = luaL_checkinteger(L, 3);
  }
  ret = uv_tcp_keepalive(handle, enable, delay);
  return luv_result(L, ret);
}